

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O2

char * __thiscall
despot::util::tinyxml::TiXmlAttribute::Parse
          (TiXmlAttribute *this,char *p,TiXmlParsingData *data,TiXmlEncoding encoding)

{
  byte bVar1;
  TiXmlDocument *this_00;
  bool bVar2;
  byte *now;
  char *pcVar3;
  ulong uVar4;
  TiXmlEncoding extraout_EDX;
  TiXmlEncoding extraout_EDX_00;
  TiXmlEncoding encoding_00;
  
  now = (byte *)TiXmlBase::SkipWhiteSpace(p,encoding);
  if (now == (byte *)0x0) {
    return (char *)0x0;
  }
  if (*now == 0) {
    return (char *)0x0;
  }
  encoding_00 = extraout_EDX;
  if (data != (TiXmlParsingData *)0x0) {
    TiXmlParsingData::Stamp(data,(char *)now,encoding);
    (this->super_TiXmlBase).location = data->cursor;
    encoding_00 = extraout_EDX_00;
  }
  pcVar3 = TiXmlBase::ReadName((char *)now,&this->name,encoding_00);
  if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
    now = (byte *)TiXmlBase::SkipWhiteSpace(pcVar3,encoding);
    if ((now == (byte *)0x0) || (*now != 0x3d)) {
      this_00 = this->document;
      goto joined_r0x0017aa46;
    }
    now = (byte *)TiXmlBase::SkipWhiteSpace((char *)(now + 1),encoding);
    if (now != (byte *)0x0) {
      bVar1 = *now;
      if (bVar1 == 0x27) {
        pcVar3 = "\'";
LAB_0017aa9d:
        pcVar3 = TiXmlBase::ReadText((char *)(now + 1),&this->value,false,pcVar3,false,encoding);
        return pcVar3;
      }
      if (bVar1 == 0x22) {
        pcVar3 = "\"";
        goto LAB_0017aa9d;
      }
      if (bVar1 != 0) {
        TiXmlString::operator=(&this->value,"");
        do {
          if (*now == 0) {
            return (char *)now;
          }
          bVar2 = TiXmlBase::IsWhiteSpace(*now);
          if (bVar2) {
            return (char *)now;
          }
          uVar4 = (ulong)*now;
          if (uVar4 < 0x3f) {
            if ((0x4000800000002400U >> (uVar4 & 0x3f) & 1) != 0) {
              return (char *)now;
            }
            if ((0x8400000000U >> (uVar4 & 0x3f) & 1) != 0) break;
          }
          TiXmlString::operator+=(&this->value,*now);
          now = now + 1;
        } while( true );
      }
    }
  }
  this_00 = this->document;
joined_r0x0017aa46:
  if (this_00 != (TiXmlDocument *)0x0) {
    TiXmlDocument::SetError(this_00,7,(char *)now,data,encoding);
  }
  return (char *)0x0;
}

Assistant:

const char* TiXmlAttribute::Parse(const char* p, TiXmlParsingData* data,
	TiXmlEncoding encoding) {
	p = SkipWhiteSpace(p, encoding);
	if (!p || !*p)
		return 0;

	//	int tabsize = 4;
	//	if ( document )
	//		tabsize = document->TabSize();

	if (data) {
		data->Stamp(p, encoding);
		location = data->Cursor();
	}
	// Read the name, the '=' and the value.
	const char* pErr = p;
	p = ReadName(p, &name, encoding);
	if (!p || !*p) {
		if (document)
			document->SetError(TIXML_ERROR_READING_ATTRIBUTES, pErr, data,
				encoding);
		return 0;
	}
	p = SkipWhiteSpace(p, encoding);
	if (!p || !*p || *p != '=') {
		if (document)
			document->SetError(TIXML_ERROR_READING_ATTRIBUTES, p, data,
				encoding);
		return 0;
	}

	++p; // skip '='
	p = SkipWhiteSpace(p, encoding);
	if (!p || !*p) {
		if (document)
			document->SetError(TIXML_ERROR_READING_ATTRIBUTES, p, data,
				encoding);
		return 0;
	}

	const char* end;
	const char SINGLE_QUOTE = '\'';
	const char DOUBLE_QUOTE = '\"';

	if (*p == SINGLE_QUOTE) {
		++p;
		end = "\'"; // single quote in string
		p = ReadText(p, &value, false, end, false, encoding);
	} else if (*p == DOUBLE_QUOTE) {
		++p;
		end = "\""; // double quote in string
		p = ReadText(p, &value, false, end, false, encoding);
	} else {
		// All attribute values should be in single or double quotes.
		// But this is such a common error that the parser will try
		// its best, even without them.
		value = "";
		while (p && *p // existence
			&& !IsWhiteSpace(*p) && *p != '\n' && *p != '\r' // whitespace
			&& *p != '/' && *p != '>') // tag end
		{
			if (*p == SINGLE_QUOTE || *p == DOUBLE_QUOTE) {
				// [ 1451649 ] Attribute values with trailing quotes not handled correctly
				// We did not have an opening quote but seem to have a
				// closing one. Give up and throw an error.
				if (document)
					document->SetError(TIXML_ERROR_READING_ATTRIBUTES, p, data,
						encoding);
				return 0;
			}
			value += *p;
			++p;
		}
	}
	return p;
}